

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_exp>(Mat *a,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  long *in_RDI;
  float fVar4;
  int iVar5;
  float fVar7;
  float fVar8;
  undefined1 auVar6 [16];
  float fVar9;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_exp op;
  Mat *m;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  int local_6c4;
  undefined8 local_6c0;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined4 local_6a8;
  long local_6a0;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined8 local_680;
  undefined1 (*local_678) [16];
  int local_670;
  int local_66c;
  int local_668;
  int local_664;
  int local_660;
  int local_65c;
  int local_658;
  undefined1 local_651 [9];
  long *local_648;
  undefined1 local_63d;
  int local_63c;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_618;
  undefined1 (*local_610) [16];
  undefined8 local_608;
  undefined8 uStack_600;
  undefined1 (*local_5f8) [16];
  long local_5f0;
  undefined4 local_5e4;
  long local_5e0;
  undefined1 (*local_5d8) [16];
  undefined4 local_5cc;
  int local_5c8;
  int local_5c4;
  undefined8 *local_5c0;
  undefined4 local_5b4;
  long local_5b0;
  undefined8 *local_5a0;
  undefined8 *local_578;
  undefined1 *local_570;
  undefined1 (*local_568) [16];
  undefined1 *local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 *local_340;
  float *local_338;
  float *local_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined8 local_318;
  undefined8 uStack_310;
  float local_308 [2];
  float afStack_300 [2];
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 *local_2e0;
  float *local_2d8;
  float *local_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_2a8 [2];
  float afStack_2a0 [2];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float local_1e8 [2];
  float afStack_1e0 [2];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188 [2];
  float afStack_180 [2];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  float local_128 [2];
  float afStack_120 [2];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8 [2];
  float afStack_c0 [2];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68 [2];
  float afStack_60 [2];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_658 = *(int *)((long)in_RDI + 0x2c);
  local_65c = (int)in_RDI[6];
  local_660 = *(int *)((long)in_RDI + 0x34);
  local_664 = (int)in_RDI[7];
  local_668 = (int)in_RDI[3];
  local_66c = local_658 * local_65c * local_660 * local_668;
  local_648 = in_RDI;
  for (local_670 = 0; local_670 < local_664; local_670 = local_670 + 1) {
    local_630 = &local_6c0;
    local_5c4 = *(int *)((long)local_648 + 0x2c);
    local_5c8 = (int)local_648[6];
    local_5cc = *(undefined4 *)((long)local_648 + 0x34);
    local_5d8 = (undefined1 (*) [16])(*local_648 + local_648[8] * (long)local_670 * local_648[2]);
    local_5e0 = local_648[2];
    local_5e4 = (undefined4)local_648[3];
    local_5f0 = local_648[4];
    local_5c0 = &local_6c0;
    local_5b0 = (long)local_5c4 * (long)local_5c8 * local_5e0;
    local_628 = &local_6c0;
    local_618 = &local_6c0;
    local_5b4 = 0x10;
    local_63c = local_670;
    local_63d = 1;
    local_6c0 = 0;
    local_6b0 = 0;
    local_6a8 = 0;
    local_698 = 0;
    local_694 = 0;
    local_690 = 0;
    local_68c = 0;
    local_688 = 0;
    local_680 = 0;
    local_6b8 = 0;
    local_678 = local_5d8;
    for (local_6c4 = 0; local_5a0 = local_618, local_6a0 = local_5f0, local_6c4 + 3 < local_66c;
        local_6c4 = local_6c4 + 4) {
      local_610 = local_678;
      local_3b8 = *(undefined8 *)*local_678;
      uStack_3b0 = *(undefined8 *)(*local_678 + 8);
      local_570 = local_651;
      local_578 = &local_6d8;
      local_488 = 0;
      uStack_480 = 0;
      local_528 = 0x3f8000003f800000;
      uStack_520 = 0x3f8000003f800000;
      local_3c8 = 0x42b0c0a542b0c0a5;
      uStack_3c0 = 0x42b0c0a542b0c0a5;
      auVar6._8_8_ = 0x42b0c0a542b0c0a5;
      auVar6._0_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = minps(*local_678,auVar6);
      local_4e8 = auVar6._0_8_;
      local_398 = local_4e8;
      uStack_4e0 = auVar6._8_8_;
      uStack_390 = uStack_4e0;
      local_3a8 = 0xc2b0c0a5c2b0c0a5;
      uStack_3a0 = 0xc2b0c0a5c2b0c0a5;
      auVar3._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6 = maxps(auVar6,auVar3);
      local_4e8 = auVar6._0_8_;
      uVar1 = local_4e8;
      uStack_4e0 = auVar6._8_8_;
      uVar2 = uStack_4e0;
      local_3e8 = 0x3fb8aa3b3fb8aa3b;
      uStack_3e0 = 0x3fb8aa3b3fb8aa3b;
      local_3d8._0_4_ = auVar6._0_4_;
      local_3d8._4_4_ = auVar6._4_4_;
      uStack_3d0._0_4_ = auVar6._8_4_;
      uStack_3d0._4_4_ = auVar6._12_4_;
      local_358 = CONCAT44(local_3d8._4_4_ * 1.442695,(float)local_3d8 * 1.442695);
      uStack_350 = CONCAT44(uStack_3d0._4_4_ * 1.442695,(float)uStack_3d0 * 1.442695);
      local_368 = 0x3f0000003f000000;
      uStack_360 = 0x3f0000003f000000;
      fVar4 = (float)local_3d8 * 1.442695 + 0.5;
      fVar7 = local_3d8._4_4_ * 1.442695 + 0.5;
      fVar8 = (float)uStack_3d0 * 1.442695 + 0.5;
      fVar9 = uStack_3d0._4_4_ * 1.442695 + 0.5;
      local_458 = CONCAT44(fVar7,fVar4);
      uStack_450 = CONCAT44(fVar9,fVar8);
      local_478 = CONCAT44((int)fVar7,(int)fVar4);
      uStack_470 = CONCAT44((int)fVar9,(int)fVar8);
      local_508 = (float)(int)fVar4;
      fStack_504 = (float)(int)fVar7;
      fStack_500 = (float)(int)fVar8;
      fStack_4fc = (float)(int)fVar9;
      local_4f8 = CONCAT44(fStack_504,local_508);
      uStack_4f0 = CONCAT44(fStack_4fc,fStack_500);
      local_438 = local_4f8;
      uStack_430 = uStack_4f0;
      local_448 = CONCAT44(fVar7,fVar4);
      uStack_440 = CONCAT44(fVar9,fVar8);
      local_538 = CONCAT44(-(uint)(fVar7 < fStack_504),-(uint)(fVar4 < local_508));
      uStack_530 = CONCAT44(-(uint)(fVar9 < fStack_4fc),-(uint)(fVar8 < fStack_500));
      local_4b8 = local_538;
      uStack_4b0 = uStack_530;
      local_4c8 = 0x3f8000003f800000;
      uStack_4c0 = 0x3f8000003f800000;
      local_538 = local_538 & 0x3f8000003f800000;
      uStack_530 = uStack_530 & 0x3f8000003f800000;
      local_498 = local_4f8;
      uStack_490 = uStack_4f0;
      local_4a8._0_4_ = (float)local_538;
      local_4a8._4_4_ = (float)(local_538 >> 0x20);
      uStack_4a0._0_4_ = (float)uStack_530;
      uStack_4a0._4_4_ = (float)(uStack_530 >> 0x20);
      local_508 = local_508 - (float)local_4a8;
      fStack_504 = fStack_504 - local_4a8._4_4_;
      fStack_500 = fStack_500 - (float)uStack_4a0;
      fStack_4fc = fStack_4fc - uStack_4a0._4_4_;
      local_330 = &local_508;
      local_2d8 = ::_ps_cephes_exp_C1;
      local_340 = &local_4e8;
      local_2b8 = local_4e8;
      uStack_2b0 = uStack_4e0;
      local_298 = CONCAT44(fStack_504,local_508);
      uStack_290 = CONCAT44(fStack_4fc,fStack_500);
      local_2a8[0] = 0.6933594;
      local_2a8[1] = 0.6933594;
      afStack_2a0[0] = 0.6933594;
      afStack_2a0[1] = 0.6933594;
      local_2c8 = local_508 * 0.6933594;
      fStack_2c4 = fStack_504 * 0.6933594;
      fStack_2c0 = fStack_500 * 0.6933594;
      fStack_2bc = fStack_4fc * 0.6933594;
      local_4e8 = CONCAT44(local_3d8._4_4_ - fStack_2c4,(float)local_3d8 - local_2c8);
      uStack_4e0._0_4_ = (float)uStack_3d0 - fStack_2c0;
      uStack_4e0._4_4_ = uStack_3d0._4_4_ - fStack_2bc;
      local_338 = ::_ps_cephes_exp_C2;
      local_318 = local_4e8;
      uStack_310 = uStack_4e0;
      local_2f8 = CONCAT44(fStack_504,local_508);
      uStack_2f0 = CONCAT44(fStack_4fc,fStack_500);
      local_308[0] = -0.00021219444;
      local_308[1] = -0.00021219444;
      afStack_300[0] = -0.00021219444;
      afStack_300[1] = -0.00021219444;
      local_328 = local_508 * -0.00021219444;
      fStack_324 = fStack_504 * -0.00021219444;
      fStack_320 = fStack_500 * -0.00021219444;
      fStack_31c = fStack_4fc * -0.00021219444;
      fVar4 = ((float)local_3d8 - local_2c8) - local_328;
      fVar7 = (local_3d8._4_4_ - fStack_2c4) - fStack_324;
      fVar8 = ((float)uStack_3d0 - fStack_2c0) - fStack_320;
      fVar9 = (uStack_3d0._4_4_ - fStack_2bc) - fStack_31c;
      local_4e8 = CONCAT44(fVar7,fVar4);
      uStack_4e0._0_4_ = fVar8;
      uStack_4e0._4_4_ = fVar9;
      local_408 = local_4e8;
      uStack_400 = uStack_4e0;
      local_4f8 = CONCAT44(fVar7 * fVar7,fVar4 * fVar4);
      uStack_4f0 = CONCAT44(fVar9 * fVar9,fVar8 * fVar8);
      local_270 = &local_548;
      local_a0 = ::_ps_cephes_exp_p1;
      local_78 = 0x3950696739506967;
      uStack_70 = 0x3950696739506967;
      local_88 = local_4e8;
      uStack_80 = uStack_4e0;
      local_58 = fVar4 * 0.00019875691;
      fStack_54 = fVar7 * 0.00019875691;
      fStack_50 = fVar8 * 0.00019875691;
      fStack_4c = fVar9 * 0.00019875691;
      local_68[0] = 0.0013981999;
      local_68[1] = 0.0013981999;
      afStack_60[0] = 0.0013981999;
      afStack_60[1] = 0.0013981999;
      local_548 = CONCAT44(fStack_54 + 0.0013981999,local_58 + 0.0013981999);
      uStack_540 = CONCAT44(fStack_4c + 0.0013981999,fStack_50 + 0.0013981999);
      local_100 = ::_ps_cephes_exp_p2;
      local_d8 = local_548;
      uStack_d0 = uStack_540;
      local_e8 = local_4e8;
      uStack_e0 = uStack_4e0;
      local_b8 = (local_58 + 0.0013981999) * fVar4;
      fStack_b4 = (fStack_54 + 0.0013981999) * fVar7;
      fStack_b0 = (fStack_50 + 0.0013981999) * fVar8;
      fStack_ac = (fStack_4c + 0.0013981999) * fVar9;
      local_c8[0] = 0.008333452;
      local_c8[1] = 0.008333452;
      afStack_c0[0] = 0.008333452;
      afStack_c0[1] = 0.008333452;
      local_548 = CONCAT44(fStack_b4 + 0.008333452,local_b8 + 0.008333452);
      uStack_540 = CONCAT44(fStack_ac + 0.008333452,fStack_b0 + 0.008333452);
      local_160 = ::_ps_cephes_exp_p3;
      local_138 = local_548;
      uStack_130 = uStack_540;
      local_148 = local_4e8;
      uStack_140 = uStack_4e0;
      local_118 = (local_b8 + 0.008333452) * fVar4;
      fStack_114 = (fStack_b4 + 0.008333452) * fVar7;
      fStack_110 = (fStack_b0 + 0.008333452) * fVar8;
      fStack_10c = (fStack_ac + 0.008333452) * fVar9;
      local_128[0] = 0.041665796;
      local_128[1] = 0.041665796;
      afStack_120[0] = 0.041665796;
      afStack_120[1] = 0.041665796;
      local_548 = CONCAT44(fStack_114 + 0.041665796,local_118 + 0.041665796);
      uStack_540 = CONCAT44(fStack_10c + 0.041665796,fStack_110 + 0.041665796);
      local_1c0 = ::_ps_cephes_exp_p4;
      local_198 = local_548;
      uStack_190 = uStack_540;
      local_1a8 = local_4e8;
      uStack_1a0 = uStack_4e0;
      local_178 = (local_118 + 0.041665796) * fVar4;
      fStack_174 = (fStack_114 + 0.041665796) * fVar7;
      fStack_170 = (fStack_110 + 0.041665796) * fVar8;
      fStack_16c = (fStack_10c + 0.041665796) * fVar9;
      local_188[0] = 0.16666666;
      local_188[1] = 0.16666666;
      afStack_180[0] = 0.16666666;
      afStack_180[1] = 0.16666666;
      local_548 = CONCAT44(fStack_174 + 0.16666666,local_178 + 0.16666666);
      uStack_540 = CONCAT44(fStack_16c + 0.16666666,fStack_170 + 0.16666666);
      local_220 = ::_ps_cephes_exp_p5;
      local_1f8 = local_548;
      uStack_1f0 = uStack_540;
      local_208 = local_4e8;
      uStack_200 = uStack_4e0;
      local_1d8 = (local_178 + 0.16666666) * fVar4;
      fStack_1d4 = (fStack_174 + 0.16666666) * fVar7;
      fStack_1d0 = (fStack_170 + 0.16666666) * fVar8;
      fStack_1cc = (fStack_16c + 0.16666666) * fVar9;
      local_1e8[0] = 0.5;
      local_1e8[1] = 0.5;
      afStack_1e0[0] = 0.5;
      afStack_1e0[1] = 0.5;
      local_548 = CONCAT44(fStack_1d4 + 0.5,local_1d8 + 0.5);
      uStack_540 = CONCAT44(fStack_1cc + 0.5,fStack_1d0 + 0.5);
      local_278 = &local_4f8;
      local_258 = local_548;
      uStack_250 = uStack_540;
      local_268 = local_4f8;
      uStack_260 = uStack_4f0;
      local_238 = (local_1d8 + 0.5) * fVar4 * fVar4;
      fStack_234 = (fStack_1d4 + 0.5) * fVar7 * fVar7;
      fStack_230 = (fStack_1d0 + 0.5) * fVar8 * fVar8;
      fStack_22c = (fStack_1cc + 0.5) * fVar9 * fVar9;
      local_248 = local_4e8;
      uStack_240 = uStack_4e0;
      local_548 = CONCAT44(fStack_234 + fVar7,local_238 + fVar4);
      uStack_540 = CONCAT44(fStack_22c + fVar9,fStack_230 + fVar8);
      local_378 = local_548;
      uStack_370 = uStack_540;
      local_388 = 0x3f8000003f800000;
      uStack_380 = 0x3f8000003f800000;
      fVar4 = local_238 + fVar4 + 1.0;
      fVar7 = fStack_234 + fVar7 + 1.0;
      fVar8 = fStack_230 + fVar8 + 1.0;
      fVar9 = fStack_22c + fVar9 + 1.0;
      local_548 = CONCAT44(fVar7,fVar4);
      uStack_540 = CONCAT44(fVar9,fVar8);
      local_468 = CONCAT44(fStack_504,local_508);
      uStack_460 = CONCAT44(fStack_4fc,fStack_500);
      local_38 = CONCAT44((int)fStack_504,(int)local_508);
      uStack_30 = CONCAT44((int)fStack_4fc,(int)fStack_500);
      local_48 = 0x7f0000007f;
      uStack_40 = 0x7f0000007f;
      iVar5 = (int)local_508 + 0x7f;
      fStack_514 = (float)((int)fStack_504 + 0x7f);
      fStack_510 = (float)((int)fStack_500 + 0x7f);
      fStack_50c = (float)((int)fStack_4fc + 0x7f);
      local_18 = CONCAT44(fStack_514,iVar5);
      uStack_10 = CONCAT44(fStack_50c,fStack_510);
      local_1c = 0x17;
      local_518 = (float)(iVar5 * 0x800000);
      local_558 = CONCAT44(fStack_514,local_518);
      uStack_550 = CONCAT44(fStack_50c,fStack_510);
      local_418 = local_548;
      uStack_410 = uStack_540;
      fVar4 = fVar4 * local_518;
      fVar7 = fVar7 * fStack_514;
      fVar8 = fVar8 * fStack_510;
      fVar9 = fVar9 * fStack_50c;
      local_548 = CONCAT44(fVar7,fVar4);
      uStack_540 = CONCAT44(fVar9,fVar8);
      local_6d8 = local_548;
      uStack_6d0 = uStack_540;
      local_5f8 = local_678;
      local_608 = local_548;
      uStack_600 = uStack_540;
      *(float *)*local_678 = fVar4;
      *(float *)(*local_678 + 4) = fVar7;
      *(float *)(*local_678 + 8) = fVar8;
      *(float *)(*local_678 + 0xc) = fVar9;
      local_678 = local_678 + 1;
      local_4d8 = local_558;
      uStack_4d0 = uStack_550;
      local_4a8 = local_538;
      uStack_4a0 = uStack_530;
      local_428 = local_558;
      uStack_420 = uStack_550;
      local_3f8 = local_408;
      uStack_3f0 = uStack_400;
      local_3d8 = uVar1;
      uStack_3d0 = uVar2;
      local_2e0 = local_340;
      local_2d0 = local_330;
      local_280 = local_340;
      local_218 = local_340;
      local_210 = local_270;
      local_1b8 = local_340;
      local_1b0 = local_270;
      local_158 = local_340;
      local_150 = local_270;
      local_f8 = local_340;
      local_f0 = local_270;
      local_98 = local_340;
      local_90 = local_270;
    }
    for (; local_6c4 < local_66c; local_6c4 = local_6c4 + 1) {
      local_560 = local_651;
      local_568 = local_678;
      fVar4 = expf(*(float *)*local_678);
      *(float *)*local_678 = fVar4;
      local_678 = (undefined1 (*) [16])(*local_678 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}